

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O0

void compute_ideal_colors_and_weights_2_comp
               (image_block *blk,partition_info *pi,endpoints_and_weights *ei,int component1,
               int component2)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  float fVar28;
  int iVar29;
  uint in_ECX;
  char *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  uint in_R8D;
  uint i_1;
  uint texel_count_simd;
  vfloat4 ep1;
  vfloat4 ep0;
  vfloat4 highvalue;
  vfloat4 lowvalue;
  float idx;
  uint tix_1;
  uint j_1;
  float scale;
  float length_squared;
  float length;
  float param;
  vfloat4 point;
  uint tix;
  uint j;
  uint partition_texel_count;
  float highparam;
  float lowparam;
  line2 line;
  vfloat4 dir;
  uint i;
  vmask4 comp2_mask;
  vmask4 comp1_mask;
  float partition0_len_sq;
  bool is_constant_wes;
  float *data_vg;
  float *data_vr;
  float error_weight;
  partition_metrics pms [4];
  uint texel_count;
  uint partition_count;
  bool local_1731;
  uint local_1720;
  undefined1 local_1708 [16];
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined1 local_16c8 [16];
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1690;
  undefined1 local_1688 [16];
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1650;
  undefined1 local_1648 [16];
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined1 local_15e8 [4];
  float fStack_15e4;
  ulong uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined1 local_15a8 [4];
  float fStack_15a4;
  ulong uStack_15a0;
  float local_1590;
  uint local_158c;
  uint local_1588;
  float local_1584;
  float local_1580;
  float local_157c;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  float local_152c;
  undefined8 local_1528;
  undefined8 uStack_1520;
  uint local_150c;
  uint local_1508;
  uint local_1504;
  float local_1500;
  float local_14fc;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  ulong uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  uint local_145c;
  undefined1 local_1458 [16];
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined1 local_1428 [8];
  partition_metrics *in_stack_ffffffffffffebe0;
  undefined8 in_stack_ffffffffffffebe8;
  image_block *in_stack_ffffffffffffebf0;
  partition_info *in_stack_ffffffffffffebf8;
  undefined8 uVar30;
  float local_13f0;
  long local_13b0;
  long local_13a8;
  float local_139c;
  undefined8 local_1398 [17];
  uint local_1310;
  uint local_130c;
  uint local_1308;
  uint local_1304;
  char *local_1300;
  ushort *local_12f8;
  long local_12f0;
  undefined1 local_12e8 [16];
  ulong local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  ulong local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  ulong local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  ulong local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined1 local_1258 [16];
  undefined8 local_1248;
  undefined8 uStack_1240;
  float local_122c;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined1 local_1208 [16];
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  float local_11dc;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined1 local_1198 [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined1 local_1168 [20];
  float local_1154;
  undefined1 *local_1150;
  float local_1144;
  undefined1 *local_1140;
  undefined1 local_1134 [16];
  undefined1 local_1124 [16];
  undefined4 local_1114;
  undefined1 *local_1110;
  undefined4 local_1104;
  undefined1 *local_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10d8 [16];
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  ulong uStack_10b0;
  undefined1 local_10a8 [24];
  uint local_1090;
  uint local_108c;
  undefined1 local_1088 [24];
  undefined1 *local_1070;
  undefined1 *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  undefined4 local_1050;
  undefined4 local_104c;
  uint local_1048;
  uint local_1044;
  undefined1 *local_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined1 local_fe8 [16];
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined1 local_fa8 [16];
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined1 local_f68 [16];
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined1 local_f28 [16];
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined1 local_ee8 [16];
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  ulong local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined1 local_e38 [16];
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined1 local_e08 [16];
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined1 local_dd8 [16];
  undefined1 local_dc8 [16];
  undefined1 local_db8 [20];
  uint local_da4;
  undefined1 *local_da0;
  uint local_d94;
  undefined1 *local_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined1 local_cd8 [16];
  undefined8 *local_cc8;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined1 local_c58 [16];
  ulong local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined1 local_c08 [20];
  float local_bf4;
  undefined1 *local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined1 local_bd8 [16];
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined1 local_bb8 [16];
  undefined1 *local_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined1 *local_b80;
  undefined1 local_b78 [16];
  undefined1 *local_b60;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  undefined1 *local_b40;
  undefined1 local_b38 [16];
  undefined1 *local_b20;
  undefined1 local_b18 [16];
  undefined1 *local_b00;
  undefined1 local_af8 [16];
  undefined1 *local_ae0;
  undefined1 local_ad8 [16];
  undefined1 *local_ac0;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  undefined1 *local_aa0;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  undefined1 *local_a80;
  undefined1 local_a78 [16];
  undefined1 *local_a60;
  undefined1 local_a58 [16];
  undefined1 *local_a40;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  undefined1 *local_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined1 *local_a00;
  undefined8 local_9f8;
  ulong uStack_9f0;
  undefined1 *local_9e0;
  ulong local_9d8;
  undefined8 uStack_9d0;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  ulong local_9b8;
  undefined8 uStack_9b0;
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [8];
  undefined1 auStack_980 [8];
  undefined1 local_978 [8];
  undefined1 auStack_970 [8];
  ulong local_968;
  undefined8 uStack_960;
  ulong local_958;
  undefined8 uStack_950;
  ulong local_948;
  undefined8 uStack_940;
  ulong local_938;
  undefined8 uStack_930;
  undefined1 (*local_920) [16];
  undefined1 local_918 [16];
  undefined8 local_908;
  undefined8 uStack_900;
  undefined4 local_8f4;
  undefined1 *local_8f0;
  undefined1 local_8e8 [16];
  undefined1 *local_8d8;
  undefined1 (*local_8d0) [16];
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined4 local_8a4;
  undefined1 *local_8a0;
  undefined1 local_898 [16];
  undefined1 *local_888;
  undefined1 (*local_880) [16];
  undefined1 local_878 [16];
  undefined8 local_868;
  undefined8 uStack_860;
  undefined4 local_854;
  undefined1 *local_850;
  undefined1 local_848 [16];
  undefined1 *local_838;
  undefined4 local_82c;
  undefined1 local_828 [24];
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined1 *local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined4 local_7e4;
  undefined1 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined4 local_7c4;
  undefined1 *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined4 local_7a4;
  undefined1 *local_7a0;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 local_6dc;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6bc;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 local_69c;
  undefined4 local_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 local_67c;
  undefined1 local_678 [8];
  undefined1 auStack_670 [20];
  undefined1 local_65c [8];
  undefined1 auStack_654 [8];
  undefined8 uStack_64c;
  undefined8 local_63c;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_61c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5fc;
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined1 local_5c8 [16];
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined1 local_568 [16];
  undefined8 local_558;
  undefined8 uStack_550;
  undefined1 local_548 [16];
  undefined8 local_538;
  undefined8 uStack_530;
  undefined1 local_528 [16];
  undefined8 local_518;
  undefined8 uStack_510;
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  ulong uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  undefined1 local_228 [16];
  uint local_218;
  uint local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 *local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined1 local_88 [16];
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  uint local_5c;
  undefined1 local_58 [16];
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined1 local_28 [16];
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_130c = (uint)*in_RSI;
  *(uint *)(in_RDX + 0x10) = local_130c;
  if (local_130c == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0xe2,
                  "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                 );
  }
  local_1310 = (uint)*(byte *)(in_RDI + 0xdfc);
  if (local_1310 != 0) {
    local_13a8 = in_RDI;
    if ((in_ECX == 0) && (in_R8D == 1)) {
      local_920 = (undefined1 (*) [16])(in_RDI + 0xe40);
      local_8e8 = vpermilps_avx(*local_920,4);
      local_8f0 = local_918;
      local_7a4 = 0;
      local_77c = 0;
      local_798 = 0;
      uStack_794 = 0;
      uStack_790 = 0;
      uStack_78c = 0;
      local_7b8 = 0;
      uStack_7b0 = 0;
      auVar2 = vblendps_avx(local_8e8,ZEXT816(0),4);
      local_8f4 = 0;
      local_6dc = 0;
      local_6f8 = 0;
      uStack_6f4 = 0;
      uStack_6f0 = 0;
      uStack_6ec = 0;
      local_908 = 0;
      uStack_900 = 0;
      local_918 = vblendps_avx(auVar2,ZEXT816(0),8);
      local_1268 = local_918._0_8_;
      uStack_1260 = local_918._8_8_;
      local_498 = local_918._0_8_;
      uStack_490 = local_918._8_8_;
      local_4a8 = local_918._0_8_;
      uStack_4a0 = local_918._8_8_;
      local_568 = vunpckhpd_avx(local_918,local_918);
      local_558 = local_918._0_8_;
      uVar25 = local_558;
      uStack_550 = local_918._8_8_;
      local_558._0_4_ = local_918._0_4_;
      local_558._4_4_ = local_918._4_4_;
      local_3e8 = local_558._4_4_ + (float)local_568._4_4_;
      local_139c = (float)local_558 + (float)local_568._0_4_ + local_3e8;
      local_3d8._4_4_ = 0;
      local_3d8._0_4_ = local_139c;
      local_1278 = local_3d8._0_8_;
      uStack_1270 = 0;
      local_968 = local_3d8._0_8_;
      uStack_960 = 0;
      local_13b0 = in_RDI + 0x380;
      local_8d8 = local_8f0;
      local_7a0 = local_8f0;
      local_558 = uVar25;
      fStack_3e4 = local_3e8;
      fStack_3e0 = local_3e8;
      fStack_3dc = local_3e8;
      local_3d8 = ZEXT416((uint)local_139c);
    }
    else {
      if ((in_ECX == 0) && (in_R8D == 2)) {
        local_8d0 = (undefined1 (*) [16])(in_RDI + 0xe40);
        local_898 = vpermilps_avx(*local_8d0,8);
        local_8a0 = local_8c8;
        local_7c4 = 0;
        local_75c = 0;
        local_778 = 0;
        uStack_774 = 0;
        uStack_770 = 0;
        uStack_76c = 0;
        local_7d8 = 0;
        uStack_7d0 = 0;
        auVar2 = vblendps_avx(local_898,ZEXT816(0),4);
        local_8a4 = 0;
        local_6fc = 0;
        local_718 = 0;
        uStack_714 = 0;
        uStack_710 = 0;
        uStack_70c = 0;
        local_8b8 = 0;
        uStack_8b0 = 0;
        local_8c8 = vblendps_avx(auVar2,ZEXT816(0),8);
        local_1288 = local_8c8._0_8_;
        uStack_1280 = local_8c8._8_8_;
        local_478 = local_8c8._0_8_;
        uStack_470 = local_8c8._8_8_;
        local_488 = local_8c8._0_8_;
        uStack_480 = local_8c8._8_8_;
        local_548 = vunpckhpd_avx(local_8c8,local_8c8);
        local_538 = local_8c8._0_8_;
        uVar25 = local_538;
        uStack_530 = local_8c8._8_8_;
        local_538._0_4_ = local_8c8._0_4_;
        local_538._4_4_ = local_8c8._4_4_;
        local_3c8 = local_538._4_4_ + (float)local_548._4_4_;
        local_139c = (float)local_538 + (float)local_548._0_4_ + local_3c8;
        local_3b8._4_4_ = 0;
        local_3b8._0_4_ = local_139c;
        local_1298 = local_3b8._0_8_;
        uStack_1290 = 0;
        local_958 = local_3b8._0_8_;
        uStack_950 = 0;
        local_888 = local_8a0;
        local_7c0 = local_8a0;
        local_538 = uVar25;
        fStack_3c4 = local_3c8;
        fStack_3c0 = local_3c8;
        fStack_3bc = local_3c8;
        local_3b8 = ZEXT416((uint)local_139c);
      }
      else {
        if (in_ECX != 1 || in_R8D != 2) {
          __assert_fail("component1 == 1 && component2 == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                        ,0xfd,
                        "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                       );
        }
        local_880 = (undefined1 (*) [16])(in_RDI + 0xe40);
        local_848 = vpermilps_avx(*local_880,9);
        local_850 = local_878;
        local_7e4 = 0;
        local_73c = 0;
        local_758 = 0;
        uStack_754 = 0;
        uStack_750 = 0;
        uStack_74c = 0;
        local_7f8 = 0;
        uStack_7f0 = 0;
        auVar2 = vblendps_avx(local_848,ZEXT816(0),4);
        local_854 = 0;
        local_71c = 0;
        local_738 = 0;
        uStack_734 = 0;
        uStack_730 = 0;
        uStack_72c = 0;
        local_868 = 0;
        uStack_860 = 0;
        local_878 = vblendps_avx(auVar2,ZEXT816(0),8);
        local_12a8 = local_878._0_8_;
        uStack_12a0 = local_878._8_8_;
        local_458 = local_878._0_8_;
        uStack_450 = local_878._8_8_;
        local_468 = local_878._0_8_;
        uStack_460 = local_878._8_8_;
        local_528 = vunpckhpd_avx(local_878,local_878);
        local_518 = local_878._0_8_;
        uVar25 = local_518;
        uStack_510 = local_878._8_8_;
        local_518._0_4_ = local_878._0_4_;
        local_518._4_4_ = local_878._4_4_;
        local_3a8 = local_518._4_4_ + (float)local_528._4_4_;
        local_139c = (float)local_518 + (float)local_528._0_4_ + local_3a8;
        local_398._4_4_ = 0;
        local_398._0_4_ = local_139c;
        local_12b8 = local_398._0_8_;
        uStack_12b0 = 0;
        local_948 = local_398._0_8_;
        uStack_940 = 0;
        local_13a8 = in_RDI + 0x380;
        local_838 = local_850;
        local_7e0 = local_850;
        local_518 = uVar25;
        fStack_3a4 = local_3a8;
        fStack_3a0 = local_3a8;
        fStack_39c = local_3a8;
        local_398 = ZEXT416((uint)local_139c);
      }
      local_13b0 = in_RDI + 0x700;
    }
    local_139c = local_139c / 2.0;
    local_1308 = in_R8D;
    local_1304 = in_ECX;
    local_1300 = in_RDX;
    local_12f8 = in_RSI;
    local_12f0 = in_RDI;
    compute_avgs_and_dirs_2_comp
              (in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
               (uint)((ulong)in_stack_ffffffffffffebe8 >> 0x20),(uint)in_stack_ffffffffffffebe8,
               in_stack_ffffffffffffebe0);
    local_1731 = true;
    local_13f0 = 0.0;
    local_8c = 3;
    local_90 = 2;
    local_94 = 1;
    local_98 = 0;
    auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
    auVar2 = vpinsrd_avx(auVar2,2,2);
    local_a8 = vpinsrd_avx(auVar2,3,3);
    local_350 = local_db8;
    local_368 = local_a8._0_8_;
    uStack_360 = local_a8._8_8_;
    local_da0 = local_1428;
    local_da4 = local_1304;
    local_2c = local_1304;
    local_4 = local_1304;
    local_8 = local_1304;
    local_c = local_1304;
    local_10 = local_1304;
    auVar2 = vpinsrd_avx(ZEXT416(local_1304),local_1304,1);
    auVar2 = vpinsrd_avx(auVar2,local_1304,2);
    local_28 = vpinsrd_avx(auVar2,local_1304,3);
    local_de8 = local_a8._0_8_;
    uStack_de0 = local_a8._8_8_;
    local_df8 = local_28._0_8_;
    uStack_df0 = local_28._8_8_;
    local_148 = local_28._0_8_;
    local_108 = vpcmpeqd_avx(local_a8,local_28);
    local_f0 = local_dd8;
    uVar25 = local_108._8_8_;
    local_b8 = local_108._0_8_;
    uStack_b0 = local_108._8_8_;
    local_60 = 3;
    local_64 = 2;
    local_68 = 1;
    local_6c = 0;
    auVar2 = vpinsrd_avx(ZEXT416(0),1,1);
    auVar2 = vpinsrd_avx(auVar2,2,2);
    local_88 = vpinsrd_avx(auVar2,3,3);
    local_330 = local_dc8;
    local_348 = local_88._0_8_;
    uStack_340 = local_88._8_8_;
    local_1448 = local_88._0_8_;
    uStack_1440 = local_88._8_8_;
    local_d90 = local_1458;
    local_d94 = local_1308;
    local_5c = local_1308;
    local_30 = local_1308;
    local_34 = local_1308;
    local_38 = local_1308;
    local_3c = local_1308;
    auVar2 = vpinsrd_avx(ZEXT416(local_1308),local_1308,1);
    auVar2 = vpinsrd_avx(auVar2,local_1308,2);
    local_58 = vpinsrd_avx(auVar2,local_1308,3);
    local_e18 = local_88._0_8_;
    uStack_e10 = local_88._8_8_;
    local_e28 = local_58._0_8_;
    uStack_e20 = local_58._8_8_;
    local_118 = local_88._0_8_;
    uStack_110 = local_88._8_8_;
    local_128 = local_58._0_8_;
    uStack_120 = local_58._8_8_;
    local_e8 = vpcmpeqd_avx(local_88,local_58);
    local_d0 = local_e08;
    local_c8 = local_e8._0_8_;
    uStack_c0 = local_e8._8_8_;
    local_1438 = local_e8._0_8_;
    uStack_1430 = local_e8._8_8_;
    local_145c = 0;
    uVar30 = local_108._0_8_;
    do {
      if (local_130c <= local_145c) {
        for (local_1720 = local_1310; local_1720 < (local_1310 + 7 & 0xfffffff8);
            local_1720 = local_1720 + 1) {
          pcVar1 = local_1300 + (ulong)local_1720 * 4 + 0xa0;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1 = local_1300 + (ulong)local_1720 * 4 + 0x400;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
        }
        *local_1300 = local_1731;
        return;
      }
      local_1488 = local_1398[(ulong)local_145c * 4 + 2];
      uStack_1480 = local_1398[(ulong)local_145c * 4 + 3];
      local_12c8 = local_1488;
      uStack_12c0 = uStack_1480;
      local_438 = local_1488;
      uStack_430 = uStack_1480;
      local_448 = local_1488;
      uStack_440 = uStack_1480;
      auVar3._8_8_ = uStack_1480;
      auVar3._0_8_ = local_1488;
      auVar2._8_8_ = uStack_1480;
      auVar2._0_8_ = local_1488;
      local_508 = vunpckhpd_avx(auVar2,auVar3);
      local_4f8 = local_1488;
      uVar23 = local_4f8;
      uStack_4f0 = uStack_1480;
      auVar2 = local_508;
      local_4f8._0_4_ = (float)local_1488;
      local_4f8._4_4_ = (float)((ulong)local_1488 >> 0x20);
      fStack_380 = local_4f8._4_4_ + (float)local_508._4_4_;
      local_388 = fStack_380;
      fStack_384 = fStack_380;
      local_378._0_4_ = (float)local_4f8 + (float)local_508._0_4_ + fStack_380;
      local_378._4_4_ = 0;
      local_12d8 = local_378._0_8_;
      uStack_12d0 = 0;
      local_938 = local_378._0_8_;
      uStack_930 = 0;
      local_1478 = local_1488;
      uStack_1470 = uStack_1480;
      if ((float)local_378._0_4_ < 0.0) {
        local_5f8 = ZEXT816(0) << 0x20;
        auVar5 = local_5f8;
        local_5f8._8_8_ = SUB168(ZEXT816(0),4);
        local_9e0 = local_12e8;
        local_9f8 = 0;
        local_9f8 = 0;
        uStack_9f0 = local_5f8._8_8_;
        local_14a8 = 0;
        uStack_14a0 = local_5f8._8_8_;
        local_10b8 = 0;
        uStack_10b0 = local_5f8._8_8_;
        local_10c8 = local_1488;
        uStack_10c0 = uStack_1480;
        local_278 = 0;
        uStack_270 = local_5f8._8_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_5f8._8_8_;
        auVar10._8_8_ = uStack_1480;
        auVar10._0_8_ = local_1488;
        local_a78 = vsubps_avx(auVar20 << 0x40,auVar10);
        local_a60 = local_10a8;
        auVar3 = local_a78;
        local_1498 = local_a78._0_8_;
        uStack_1490 = local_a78._8_8_;
        local_1478 = local_a78._0_8_;
        uStack_1470 = local_a78._8_8_;
        local_14b8 = local_1488;
        uStack_14b0 = uStack_1480;
        local_a78 = auVar3;
        local_5f8 = auVar5;
        local_288 = local_1488;
        uStack_280 = uStack_1480;
      }
      local_14d8 = local_1398[(ulong)local_145c * 4];
      uStack_14d0 = local_1398[(ulong)local_145c * 4 + 1];
      local_14e8 = local_1478;
      uStack_14e0 = uStack_1470;
      local_82c = 0x3f3504f3;
      local_800 = local_828;
      local_804 = 0x3f3504f3;
      local_808 = 0x3f3504f3;
      local_80c = 0;
      local_810 = 0;
      local_22c = 0;
      local_230 = 0;
      local_234 = 0x3f3504f3;
      local_238 = 0x3f3504f3;
      auVar3 = vinsertps_avx(ZEXT416(0x3f3504f3),ZEXT416(0x3f3504f3),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
      local_248 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
      local_14f8 = local_248._0_8_;
      uStack_14f0 = local_248._8_8_;
      local_d18 = local_1478;
      uStack_d10 = uStack_1470;
      local_d28 = local_248._0_8_;
      uStack_d20 = local_248._8_8_;
      local_d48 = local_1478;
      uStack_d40 = uStack_1470;
      local_d58 = local_1478;
      uStack_d50 = uStack_1470;
      local_c68 = local_1478;
      uStack_c60 = uStack_1470;
      local_c78 = local_1478;
      uStack_c70 = uStack_1470;
      local_c98 = local_1478;
      uStack_c90 = uStack_1470;
      local_ca8 = local_1478;
      uStack_ca0 = uStack_1470;
      local_c18 = local_1478;
      uStack_c10 = uStack_1470;
      local_c28 = local_1478;
      uStack_c20 = uStack_1470;
      local_318 = local_1478;
      uVar24 = local_318;
      uStack_310 = uStack_1470;
      uVar26 = uStack_310;
      local_328 = local_1478;
      uStack_320 = uStack_1470;
      local_318._0_4_ = (float)local_1478;
      local_318._4_4_ = (float)((ulong)local_1478 >> 0x20);
      uStack_310._0_4_ = (float)uStack_1470;
      uStack_310._4_4_ = (float)((ulong)uStack_1470 >> 0x20);
      local_b98 = (float)local_318 * (float)local_318;
      fStack_b94 = local_318._4_4_ * local_318._4_4_;
      local_b80 = local_c08;
      fStack_b90 = (float)uStack_310 * (float)uStack_310;
      fStack_b8c = uStack_310._4_4_ * uStack_310._4_4_;
      local_c88 = CONCAT44(fStack_b94,local_b98);
      uStack_c80 = CONCAT44(uStack_310._4_4_ * uStack_310._4_4_,
                            (float)uStack_310 * (float)uStack_310);
      local_cb8 = local_c88;
      uStack_cb0 = uStack_c80;
      local_c38 = local_c88;
      uStack_c30 = uStack_c80;
      local_4d8 = local_c88;
      uStack_4d0 = uStack_c80;
      local_4e8 = local_c88;
      uStack_4e0 = uStack_c80;
      auVar6._8_8_ = uStack_c80;
      auVar6._0_8_ = local_c88;
      auVar5._8_8_ = uStack_c80;
      auVar5._0_8_ = local_c88;
      local_5e8 = vunpckhpd_avx(auVar5,auVar6);
      local_5d8 = local_c88;
      uStack_5d0 = uStack_c80;
      auVar3 = local_5e8;
      local_428 = fStack_b94 + (float)local_5e8._4_4_;
      fStack_424 = local_428;
      fStack_420 = local_428;
      fStack_41c = local_428;
      local_bf4 = local_b98 + (float)local_5e8._0_4_ + local_428;
      local_418 = ZEXT416((uint)local_bf4);
      auVar10 = local_418;
      local_418._4_4_ = 0;
      local_418._0_4_ = local_bf4;
      local_c48 = local_418._0_8_;
      uStack_c40 = 0;
      local_9d8 = local_418._0_8_;
      uStack_9d0 = 0;
      local_bf0 = local_c58;
      local_6bc = local_bf4;
      local_6d8 = local_bf4;
      fStack_6d4 = local_bf4;
      fStack_6d0 = local_bf4;
      fStack_6cc = local_bf4;
      local_d38 = CONCAT44(local_bf4,local_bf4);
      uStack_d30 = CONCAT44(local_bf4,local_bf4);
      local_cc8 = &local_d38;
      local_9c8 = local_bf4;
      fStack_9c4 = local_bf4;
      fStack_9c0 = local_bf4;
      fStack_9bc = local_bf4;
      if ((local_bf4 != 0.0) || (NAN(local_bf4))) {
        local_d68 = local_1478;
        uStack_d60 = uStack_1470;
        local_d88 = local_d38;
        uStack_d80 = uStack_d30;
        local_be8 = local_d38;
        uStack_be0 = uStack_d30;
        local_bc8 = local_d38;
        uStack_bc0 = uStack_d30;
        auVar4._8_8_ = uStack_d30;
        auVar4._0_8_ = local_d38;
        local_bb8 = vsqrtps_avx(auVar4);
        local_ba0 = local_bd8;
        auVar20 = local_bb8;
        local_d78 = local_bb8._0_8_;
        uStack_d70 = local_bb8._8_8_;
        local_ce8 = local_1478;
        uStack_ce0 = uStack_1470;
        local_cf8 = local_bb8._0_8_;
        uStack_cf0 = local_bb8._8_8_;
        local_298 = local_1478;
        uStack_290 = uStack_1470;
        local_2a8 = local_bb8._0_8_;
        uStack_2a0 = local_bb8._8_8_;
        auVar9._8_8_ = uStack_1470;
        auVar9._0_8_ = local_1478;
        local_b78 = vdivps_avx(auVar9,local_bb8);
        local_b60 = local_cd8;
        auVar5 = local_b78;
        local_d08 = local_b78._0_8_;
        uStack_d00 = local_b78._8_8_;
        local_bb8 = auVar20;
        local_b78 = auVar5;
      }
      else {
        local_d08 = local_248._0_8_;
        uStack_d00 = local_248._8_8_;
      }
      local_14c8 = local_d08;
      uStack_14c0 = uStack_d00;
      local_14fc = 1e+10;
      local_1500 = -1e+10;
      local_1504 = (uint)*(byte *)((long)local_12f8 + (ulong)local_145c + 4);
      local_5e8 = auVar3;
      local_508 = auVar2;
      local_4f8 = uVar23;
      local_418 = auVar10;
      fStack_37c = fStack_380;
      local_378 = ZEXT416((uint)local_378._0_4_);
      local_318 = uVar24;
      uStack_310 = uVar26;
      for (local_1508 = 0; local_1508 < local_1504; local_1508 = local_1508 + 1) {
        local_150c = (uint)*(byte *)((long)local_12f8 +
                                    (ulong)local_1508 + 0x100 + (ulong)local_145c * 0xd8);
        local_108c = *(uint *)(local_13a8 + (ulong)local_150c * 4);
        local_1090 = *(uint *)(local_13b0 + (ulong)local_150c * 4);
        local_1040 = local_1088;
        local_104c = 0;
        local_1050 = 0;
        local_20c = 0;
        local_210 = 0;
        auVar2 = vinsertps_avx(ZEXT416(local_108c),ZEXT416(local_1090),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
        local_228 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
        local_1528 = local_228._0_8_;
        uStack_1520 = local_228._8_8_;
        local_1558 = local_228._0_8_;
        uStack_1550 = local_228._8_8_;
        local_1568 = local_14d8;
        uStack_1560 = uStack_14d0;
        local_10e8 = local_228._0_8_;
        uStack_10e0 = local_228._8_8_;
        local_10f8 = local_14d8;
        uStack_10f0 = uStack_14d0;
        local_258 = local_228._0_8_;
        uStack_250 = local_228._8_8_;
        local_268 = local_14d8;
        uStack_260 = uStack_14d0;
        auVar11._8_8_ = uStack_14d0;
        auVar11._0_8_ = local_14d8;
        local_a58 = vsubps_avx(local_228,auVar11);
        local_a40 = local_10d8;
        local_1548 = local_a58._0_8_;
        uStack_1540 = local_a58._8_8_;
        local_1578 = local_14c8;
        uStack_1570 = uStack_14c0;
        local_e88 = local_a58._0_8_;
        uStack_e80 = local_a58._8_8_;
        local_e98 = local_14c8;
        uStack_e90 = uStack_14c0;
        local_eb8 = local_a58._0_8_;
        uStack_eb0 = local_a58._8_8_;
        local_ec8 = local_14c8;
        uStack_ec0 = uStack_14c0;
        local_e48 = local_a58._0_8_;
        uStack_e40 = local_a58._8_8_;
        local_e58 = local_14c8;
        uStack_e50 = uStack_14c0;
        local_2f8 = local_a58._0_8_;
        uVar26 = local_2f8;
        uStack_2f0 = local_a58._8_8_;
        uVar27 = uStack_2f0;
        local_308 = local_14c8;
        uVar23 = local_308;
        uStack_300 = uStack_14c0;
        uVar24 = uStack_300;
        local_2f8._0_4_ = local_a58._0_4_;
        local_2f8._4_4_ = local_a58._4_4_;
        uStack_2f0._0_4_ = local_a58._8_4_;
        uStack_2f0._4_4_ = local_a58._12_4_;
        local_308._0_4_ = (float)local_14c8;
        local_308._4_4_ = (float)((ulong)local_14c8 >> 0x20);
        uStack_300._0_4_ = (float)uStack_14c0;
        uStack_300._4_4_ = (float)((ulong)uStack_14c0 >> 0x20);
        local_b58 = (float)local_2f8 * (float)local_308;
        fStack_b54 = local_2f8._4_4_ * local_308._4_4_;
        fStack_b50 = (float)uStack_2f0 * (float)uStack_300;
        fStack_b4c = uStack_2f0._4_4_ * uStack_300._4_4_;
        local_b40 = local_e38;
        local_ed8 = CONCAT44(fStack_b54,local_b58);
        uStack_ed0 = CONCAT44(fStack_b4c,fStack_b50);
        auVar8._8_8_ = uStack_ed0;
        auVar8._0_8_ = local_ed8;
        auVar7._8_8_ = uStack_ed0;
        auVar7._0_8_ = local_ed8;
        local_5c8 = vunpckhpd_avx(auVar7,auVar8);
        local_408 = fStack_b54 + (float)local_5c8._4_4_;
        local_152c = local_b58 + (float)local_5c8._0_4_ + local_408;
        local_3f8._4_4_ = 0;
        local_3f8._0_4_ = local_152c;
        local_e78 = local_3f8._0_8_;
        uStack_e70 = 0;
        local_9b8 = local_3f8._0_8_;
        uStack_9b0 = 0;
        *(float *)(local_1300 + (ulong)local_150c * 4 + 0xa0) = local_152c;
        local_1048 = local_1090;
        local_1044 = local_108c;
        local_ea8 = local_ed8;
        uStack_ea0 = uStack_ed0;
        local_e68 = local_ed8;
        uStack_e60 = uStack_ed0;
        local_5b8 = local_ed8;
        uStack_5b0 = uStack_ed0;
        local_4c8 = local_ed8;
        uStack_4c0 = uStack_ed0;
        local_4b8 = local_ed8;
        uStack_4b0 = uStack_ed0;
        fStack_404 = local_408;
        fStack_400 = local_408;
        fStack_3fc = local_408;
        local_3f8 = ZEXT416((uint)local_152c);
        local_308 = uVar23;
        uStack_300 = uVar24;
        local_2f8 = uVar26;
        uStack_2f0 = uVar27;
        local_218 = local_108c;
        local_214 = local_1090;
        local_14fc = astc::min<float>(local_152c,local_14fc);
        local_1500 = astc::max<float>(local_152c,local_1500);
      }
      if (local_1500 <= local_14fc) {
        local_14fc = 0.0;
        local_1500 = 1e-07;
      }
      local_157c = local_1500 - local_14fc;
      local_1580 = local_157c * local_157c;
      local_1584 = 1.0 / local_157c;
      fVar28 = local_1580;
      if (local_145c != 0) {
        local_1731 = local_1731 != false && local_1580 == local_13f0;
        fVar28 = local_13f0;
      }
      local_13f0 = fVar28;
      for (local_1588 = 0; local_1588 < local_1504; local_1588 = local_1588 + 1) {
        local_158c = (uint)*(byte *)((long)local_12f8 +
                                    (ulong)local_1588 + (ulong)local_145c * 0xd8 + 0x100);
        local_1590 = (*(float *)(local_1300 + (ulong)local_158c * 4 + 0xa0) - local_14fc) *
                     local_1584;
        local_1590 = astc::clamp1f(0.0);
        *(float *)(local_1300 + (ulong)local_158c * 4 + 0xa0) = local_1590;
        *(float *)(local_1300 + (ulong)local_158c * 4 + 0x400) = local_1580 * local_139c;
        iVar29 = astc::isnan((double)(ulong)*(uint *)(local_1300 + (ulong)local_158c * 4 + 0x400));
        if ((((byte)iVar29 ^ 0xff) & 1) == 0) {
          __assert_fail("!astc::isnan(ei.weight_error_scale[tix])",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                        ,0x142,
                        "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
                       );
        }
      }
      local_15b8 = local_14d8;
      uStack_15b0 = uStack_14d0;
      local_15d8 = local_14c8;
      uStack_15d0 = uStack_14c0;
      local_11d8 = local_14c8;
      uStack_11d0 = uStack_14c0;
      local_11dc = local_14fc;
      local_11f8 = local_14c8;
      uStack_11f0 = uStack_14c0;
      local_1150 = local_1208;
      local_1154 = local_14fc;
      local_5fc = local_14fc;
      local_618 = local_14fc;
      fStack_614 = local_14fc;
      fStack_610 = local_14fc;
      fStack_60c = local_14fc;
      local_2c8 = CONCAT44(local_14fc,local_14fc);
      uStack_2c0 = CONCAT44(local_14fc,local_14fc);
      local_11a8 = local_14c8;
      uStack_11a0 = uStack_14c0;
      local_11b8 = local_2c8;
      uStack_11b0 = uStack_2c0;
      local_2b8 = local_14c8;
      uVar26 = local_2b8;
      uStack_2b0 = uStack_14c0;
      uVar27 = uStack_2b0;
      local_2b8._0_4_ = (float)local_14c8;
      local_2b8._4_4_ = (float)((ulong)local_14c8 >> 0x20);
      uStack_2b0._0_4_ = (float)uStack_14c0;
      uStack_2b0._4_4_ = (float)((ulong)uStack_14c0 >> 0x20);
      local_a18 = (float)local_2b8 * local_14fc;
      fStack_a14 = local_2b8._4_4_ * local_14fc;
      fStack_a10 = (float)uStack_2b0 * local_14fc;
      fStack_a0c = uStack_2b0._4_4_ * local_14fc;
      local_a00 = local_1198;
      local_15c8 = CONCAT44(fStack_a14,local_a18);
      uStack_15c0 = CONCAT44(fStack_a0c,fStack_a10);
      local_11c8 = local_15c8;
      uStack_11c0 = uStack_15c0;
      local_ff8 = local_14d8;
      uStack_ff0 = uStack_14d0;
      local_1008 = local_15c8;
      uStack_1000 = uStack_15c0;
      local_598 = local_14d8;
      uVar23 = local_598;
      uStack_590 = uStack_14d0;
      uVar24 = uStack_590;
      local_5a8 = local_15c8;
      uStack_5a0 = uStack_15c0;
      local_598._0_4_ = (float)local_14d8;
      local_598._4_4_ = (float)((ulong)local_14d8 >> 0x20);
      uStack_590._0_4_ = (float)uStack_14d0;
      uStack_590._4_4_ = (float)((ulong)uStack_14d0 >> 0x20);
      fStack_15a4 = local_598._4_4_ + fStack_a14;
      local_aa0 = local_fe8;
      local_ab8 = (float)local_598 + local_a18;
      fStack_ab4 = fStack_15a4;
      fStack_ab0 = (float)uStack_590 + fStack_a10;
      fStack_aac = uStack_590._4_4_ + fStack_a0c;
      uStack_1f0 = CONCAT44(fStack_15a4,(float)local_598 + local_a18);
      uStack_15a0 = CONCAT44(uStack_590._4_4_ + fStack_a0c,(float)uStack_590 + fStack_a10);
      local_15f8 = local_14d8;
      uStack_15f0 = uStack_14d0;
      local_1618 = local_14c8;
      uStack_1610 = uStack_14c0;
      local_1228 = local_14c8;
      uStack_1220 = uStack_14c0;
      local_122c = local_1500;
      local_1248 = local_14c8;
      uStack_1240 = uStack_14c0;
      local_1140 = local_1258;
      local_1144 = local_1500;
      local_61c = local_1500;
      local_63c._4_4_ = local_1500;
      fStack_634 = local_1500;
      fStack_630 = local_1500;
      fStack_62c = local_1500;
      local_2e8 = CONCAT44(local_1500,local_1500);
      uStack_2e0 = CONCAT44(local_1500,local_1500);
      local_1178 = local_14c8;
      uStack_1170 = uStack_14c0;
      local_1188 = local_2e8;
      uStack_1180 = uStack_2e0;
      local_2d8 = local_14c8;
      uStack_2d0 = uStack_14c0;
      local_a38 = (float)local_2b8 * local_1500;
      fStack_a34 = local_2b8._4_4_ * local_1500;
      fStack_a30 = (float)uStack_2b0 * local_1500;
      fStack_a2c = uStack_2b0._4_4_ * local_1500;
      local_a20 = local_1168;
      local_1608 = CONCAT44(fStack_a34,local_a38);
      uStack_1600 = CONCAT44(fStack_a2c,fStack_a30);
      local_1218 = local_1608;
      uStack_1210 = uStack_1600;
      local_1028 = local_14d8;
      uStack_1020 = uStack_14d0;
      local_1038 = local_1608;
      uStack_1030 = uStack_1600;
      local_578 = local_14d8;
      uStack_570 = uStack_14d0;
      local_588 = local_1608;
      uStack_580 = uStack_1600;
      fStack_15e4 = local_598._4_4_ + fStack_a34;
      local_a80 = local_1018;
      local_a98 = (float)local_598 + local_a38;
      fStack_a94 = fStack_15e4;
      fStack_a90 = (float)uStack_590 + fStack_a30;
      fStack_a8c = uStack_590._4_4_ + fStack_a2c;
      uStack_1c0 = CONCAT44(fStack_15e4,(float)local_598 + local_a38);
      uStack_15e0 = CONCAT44(uStack_590._4_4_ + fStack_a2c,(float)uStack_590 + fStack_a30);
      local_1638 = *(undefined8 *)*(undefined1 (*) [16])(local_12f0 + 0xe10);
      uStack_1630 = *(undefined8 *)(local_12f0 + 0xe18);
      local_1068 = local_15a8;
      local_988._0_4_ = (undefined4)uStack_1f0;
      local_988._4_4_ = (undefined4)uStack_1f0;
      auStack_980._0_4_ = (undefined4)uStack_1f0;
      auStack_980._4_4_ = (undefined4)uStack_1f0;
      local_1134._4_8_ = local_1648;
      local_1134._0_4_ = (undefined4)uStack_1f0;
      local_63c._0_4_ = uStack_1f0;
      local_65c._4_4_ = (undefined4)uStack_1f0;
      auStack_654._0_4_ = (undefined4)uStack_1f0;
      auStack_654._4_4_ = (undefined4)uStack_1f0;
      uStack_64c._0_4_ = uStack_1f0;
      local_1f8 = CONCAT88(uStack_1f0,uStack_1f0);
      uStack_1f0 = CONCAT88(uStack_1f0,uStack_1f0);
      uStack_1650 = uVar25;
      local_ef8 = local_1638;
      uStack_ef0 = uStack_1630;
      local_f08 = local_1f8;
      uStack_f00 = uStack_1f0;
      local_f18 = uVar30;
      uStack_f10 = uVar25;
      uStack_200 = uVar25;
      auVar13._8_8_ = uStack_1f0;
      auVar13._0_8_ = local_1f8;
      auVar12._8_8_ = uVar25;
      auVar12._0_8_ = uVar30;
      local_b38 = vblendvps_avx(*(undefined1 (*) [16])(local_12f0 + 0xe10),auVar13,auVar12);
      local_b20 = local_ee8;
      auVar2 = local_b38;
      local_1628 = local_b38._0_8_;
      uStack_1620 = local_b38._8_8_;
      local_1678 = *(undefined8 *)*(undefined1 (*) [16])(local_12f0 + 0xe30);
      uStack_1670 = *(undefined8 *)(local_12f0 + 0xe38);
      local_1070 = local_15e8;
      local_978._0_4_ = (undefined4)uStack_1c0;
      local_978._4_4_ = (undefined4)uStack_1c0;
      auStack_970._0_4_ = (undefined4)uStack_1c0;
      auStack_970._4_4_ = (undefined4)uStack_1c0;
      local_1124._4_8_ = local_1688;
      local_1124._0_4_ = (undefined4)uStack_1c0;
      local_65c._0_4_ = (undefined4)uStack_1c0;
      local_678._0_4_ = (undefined4)uStack_1c0;
      local_678._4_4_ = (undefined4)uStack_1c0;
      auStack_670._0_4_ = (undefined4)uStack_1c0;
      auStack_670._4_4_ = (undefined4)uStack_1c0;
      local_1c8 = CONCAT88(uStack_1c0,uStack_1c0);
      uStack_1c0 = CONCAT88(uStack_1c0,uStack_1c0);
      uStack_1690 = uVar25;
      local_f38 = local_1678;
      uStack_f30 = uStack_1670;
      local_f48 = local_1c8;
      uStack_f40 = uStack_1c0;
      local_f58 = uVar30;
      uStack_f50 = uVar25;
      uStack_1d0 = uVar25;
      auVar15._8_8_ = uStack_1c0;
      auVar15._0_8_ = local_1c8;
      auVar14._8_8_ = uVar25;
      auVar14._0_8_ = uVar30;
      local_b18 = vblendvps_avx(*(undefined1 (*) [16])(local_12f0 + 0xe30),auVar15,auVar14);
      local_b00 = local_f28;
      auVar3 = local_b18;
      local_1668 = local_b18._0_8_;
      uStack_1660 = local_b18._8_8_;
      local_16b8 = local_b38._0_8_;
      uStack_16b0 = local_b38._8_8_;
      local_1058 = local_15a8;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uStack_15a0;
      local_9a8 = vpermilps_avx(auVar21 << 0x40,1);
      auVar5 = local_9a8;
      local_1110 = local_16c8;
      local_1114 = local_9a8._0_4_;
      local_67c = local_9a8._0_4_;
      local_698 = local_9a8._0_4_;
      uStack_694 = local_9a8._0_4_;
      uStack_690 = local_9a8._0_4_;
      uStack_68c = local_9a8._0_4_;
      local_198 = CONCAT44(local_9a8._0_4_,local_9a8._0_4_);
      uStack_190 = CONCAT44(local_9a8._0_4_,local_9a8._0_4_);
      local_16d8 = local_1438;
      uStack_16d0 = uStack_1430;
      local_f78 = local_b38._0_8_;
      uStack_f70 = local_b38._8_8_;
      local_f88 = local_198;
      uStack_f80 = uStack_190;
      local_f98 = local_1438;
      uStack_f90 = uStack_1430;
      local_188 = local_b38._0_8_;
      uStack_180 = local_b38._8_8_;
      local_1a8 = local_1438;
      uStack_1a0 = uStack_1430;
      auVar17._8_8_ = uStack_190;
      auVar17._0_8_ = local_198;
      auVar16._8_8_ = uStack_1430;
      auVar16._0_8_ = local_1438;
      local_af8 = vblendvps_avx(local_b38,auVar17,auVar16);
      local_ae0 = local_f68;
      auVar10 = local_af8;
      local_16a8 = local_af8._0_8_;
      uStack_16a0 = local_af8._8_8_;
      *(undefined8 *)(local_1300 + (ulong)local_145c * 0x10 + 0x20) = local_af8._0_8_;
      *(undefined8 *)(local_1300 + (ulong)local_145c * 0x10 + 0x20 + 8) = local_af8._8_8_;
      local_16f8 = local_b18._0_8_;
      uStack_16f0 = local_b18._8_8_;
      local_1060 = local_15e8;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uStack_15e0;
      local_998 = vpermilps_avx(auVar22 << 0x40,1);
      auVar6 = local_998;
      local_1100 = local_1708;
      local_1104 = local_998._0_4_;
      local_69c = local_998._0_4_;
      local_6b8 = local_998._0_4_;
      uStack_6b4 = local_998._0_4_;
      uStack_6b0 = local_998._0_4_;
      uStack_6ac = local_998._0_4_;
      local_168 = CONCAT44(local_998._0_4_,local_998._0_4_);
      uStack_160 = CONCAT44(local_998._0_4_,local_998._0_4_);
      local_fb8 = local_b18._0_8_;
      uStack_fb0 = local_b18._8_8_;
      local_fc8 = local_168;
      uStack_fc0 = uStack_160;
      local_fd8 = local_1438;
      uStack_fd0 = uStack_1430;
      local_158 = local_b18._0_8_;
      uStack_150 = local_b18._8_8_;
      local_178 = local_1438;
      uStack_170 = uStack_1430;
      auVar19._8_8_ = uStack_160;
      auVar19._0_8_ = local_168;
      auVar18._8_8_ = uStack_1430;
      auVar18._0_8_ = local_1438;
      local_ad8 = vblendvps_avx(local_b18,auVar19,auVar18);
      local_ac0 = local_fa8;
      auVar20 = local_ad8;
      *(undefined8 *)(local_1300 + (ulong)local_145c * 0x10 + 0x60) = local_ad8._0_8_;
      *(undefined8 *)(local_1300 + (ulong)local_145c * 0x10 + 0x60 + 8) = local_ad8._8_8_;
      local_145c = local_145c + 1;
      local_b38 = auVar2;
      local_b18 = auVar3;
      local_af8 = auVar10;
      local_ad8 = auVar20;
      local_9a8 = auVar5;
      local_998 = auVar6;
      local_598 = uVar23;
      uStack_590 = uVar24;
      local_2b8 = uVar26;
      uStack_2b0 = uVar27;
      local_1e8 = local_1638;
      uStack_1e0 = uStack_1630;
      local_1b8 = local_1678;
      uStack_1b0 = uStack_1670;
    } while( true );
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                ,0xe5,
                "void compute_ideal_colors_and_weights_2_comp(const image_block &, const partition_info &, endpoints_and_weights &, int, int)"
               );
}

Assistant:

static void compute_ideal_colors_and_weights_2_comp(
	const image_block& blk,
	const partition_info& pi,
	endpoints_and_weights& ei,
	int component1,
	int component2
) {
	unsigned int partition_count = pi.partition_count;
	ei.ep.partition_count = partition_count;
	promise(partition_count > 0);

	unsigned int texel_count = blk.texel_count;
	promise(texel_count > 0);

	partition_metrics pms[BLOCK_MAX_PARTITIONS];

	float error_weight;
	const float* data_vr = nullptr;
	const float* data_vg = nullptr;

	if (component1 == 0 && component2 == 1)
	{
		error_weight = hadd_s(blk.channel_weight.swz<0, 1>()) / 2.0f;

		data_vr = blk.data_r;
		data_vg = blk.data_g;
	}
	else if (component1 == 0 && component2 == 2)
	{
		error_weight = hadd_s(blk.channel_weight.swz<0, 2>()) / 2.0f;

		data_vr = blk.data_r;
		data_vg = blk.data_b;
	}
	else // (component1 == 1 && component2 == 2)
	{
		assert(component1 == 1 && component2 == 2);

		error_weight = hadd_s(blk.channel_weight.swz<1, 2>()) / 2.0f;

		data_vr = blk.data_g;
		data_vg = blk.data_b;
	}

	compute_avgs_and_dirs_2_comp(pi, blk, component1, component2, pms);

	bool is_constant_wes { true };
	float partition0_len_sq { 0.0f };

	vmask4 comp1_mask = vint4::lane_id() == vint4(component1);
	vmask4 comp2_mask = vint4::lane_id() == vint4(component2);

	for (unsigned int i = 0; i < partition_count; i++)
	{
		vfloat4 dir = pms[i].dir;
		if (hadd_s(dir) < 0.0f)
		{
			dir = vfloat4::zero() - dir;
		}

		line2 line { pms[i].avg, normalize_safe(dir, unit2()) };
		float lowparam { 1e10f };
		float highparam { -1e10f };

		unsigned int partition_texel_count = pi.partition_texel_count[i];
		for (unsigned int j = 0; j < partition_texel_count; j++)
		{
			unsigned int tix = pi.texels_of_partition[i][j];
			vfloat4 point = vfloat2(data_vr[tix], data_vg[tix]);
			float param = dot_s(point - line.a, line.b);
			ei.weights[tix] = param;

			lowparam = astc::min(param, lowparam);
			highparam = astc::max(param, highparam);
		}

		// It is possible for a uniform-color partition to produce length=0;
		// this causes NaN issues so set to small value to avoid this problem
		if (highparam <= lowparam)
		{
			lowparam = 0.0f;
			highparam = 1e-7f;
		}

		float length = highparam - lowparam;
		float length_squared = length * length;
		float scale = 1.0f / length;

		if (i == 0)
		{
			partition0_len_sq = length_squared;
		}
		else
		{
			is_constant_wes = is_constant_wes && length_squared == partition0_len_sq;
		}

		for (unsigned int j = 0; j < partition_texel_count; j++)
		{
			unsigned int tix = pi.texels_of_partition[i][j];
			float idx = (ei.weights[tix] - lowparam) * scale;
			idx = astc::clamp1f(idx);

			ei.weights[tix] = idx;
			ei.weight_error_scale[tix] = length_squared * error_weight;
			assert(!astc::isnan(ei.weight_error_scale[tix]));
		}

		vfloat4 lowvalue = line.a + line.b * lowparam;
		vfloat4 highvalue = line.a + line.b * highparam;

		vfloat4 ep0 = select(blk.data_min, vfloat4(lowvalue.lane<0>()), comp1_mask);
		vfloat4 ep1 = select(blk.data_max, vfloat4(highvalue.lane<0>()), comp1_mask);

		ei.ep.endpt0[i] = select(ep0, vfloat4(lowvalue.lane<1>()), comp2_mask);
		ei.ep.endpt1[i] = select(ep1, vfloat4(highvalue.lane<1>()), comp2_mask);
	}

	// Zero initialize any SIMD over-fetch
	unsigned int texel_count_simd = round_up_to_simd_multiple_vla(texel_count);
	for (unsigned int i = texel_count; i < texel_count_simd; i++)
	{
		ei.weights[i] = 0.0f;
		ei.weight_error_scale[i] = 0.0f;
	}

	ei.is_constant_weight_error_scale = is_constant_wes;
}